

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2c8643::FloatExpr<double>::printLeft(FloatExpr<double> *this,OutputStream *s)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  anon_union_8_2_325080ff *paVar4;
  char cVar5;
  StringView R;
  anon_union_8_2_325080ff anon_var_0;
  char num [32];
  
  pcVar1 = (this->Contents).First;
  if ((char *)0x10 < (this->Contents).Last + (1 - (long)pcVar1)) {
    paVar4 = &anon_var_0;
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 2) {
      cVar5 = -0x57;
      if ((int)pcVar1[lVar3 + 1] - 0x30U < 10) {
        cVar5 = -0x30;
      }
      paVar4->buf[0] =
           ((9 < (int)pcVar1[lVar3] - 0x30U) * '\t' + pcVar1[lVar3]) * '\x10' +
           cVar5 + pcVar1[lVar3 + 1];
      paVar4 = (anon_union_8_2_325080ff *)(paVar4->buf + 1);
    }
    std::__reverse<char*>(&anon_var_0);
    num[0x10] = '\0';
    num[0x11] = '\0';
    num[0x12] = '\0';
    num[0x13] = '\0';
    num[0x14] = '\0';
    num[0x15] = '\0';
    num[0x16] = '\0';
    num[0x17] = '\0';
    num[0x18] = '\0';
    num[0x19] = '\0';
    num[0x1a] = '\0';
    num[0x1b] = '\0';
    num[0x1c] = '\0';
    num[0x1d] = '\0';
    num[0x1e] = '\0';
    num[0x1f] = '\0';
    num[0] = '\0';
    num[1] = '\0';
    num[2] = '\0';
    num[3] = '\0';
    num[4] = '\0';
    num[5] = '\0';
    num[6] = '\0';
    num[7] = '\0';
    num[8] = '\0';
    num[9] = '\0';
    num[10] = '\0';
    num[0xb] = '\0';
    num[0xc] = '\0';
    num[0xd] = '\0';
    num[0xe] = '\0';
    num[0xf] = '\0';
    iVar2 = snprintf(num,0x20,"%a",anon_var_0._0_4_);
    R.Last = num + iVar2;
    R.First = num;
    OutputStream::operator+=(s,R);
  }
  return;
}

Assistant:

const char *begin() const { return First; }